

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

int32_t __thiscall TesterThread::ACMRandom::Next(ACMRandom *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (uint)this->seed_ >> 0x10;
  uVar3 = (uVar1 * 0x41a70000 & 0x7fff0000) + (this->seed_ & 0xffffU) * 0x41a7;
  uVar2 = (uVar3 & 0x7fffffff) + 1;
  if (-1 < (int)uVar3) {
    uVar2 = uVar3;
  }
  uVar2 = (uVar1 * 0x41a7 >> 0xf) + uVar2;
  uVar1 = (uVar2 & 0x7fffffff) + 1;
  if (-1 < (int)uVar2) {
    uVar1 = uVar2;
  }
  this->seed_ = uVar1;
  return uVar1;
}

Assistant:

int32_t Next() {
      const int32_t M = 2147483647L;   // 2^31-1
      const int32_t A = 16807;
      // In effect, we are computing seed_ = (seed_ * A) % M, where M = 2^31-1
      uint32_t lo = A * (int32_t)(seed_ & 0xFFFF);
      uint32_t hi = A * (int32_t)((uint32_t)seed_ >> 16);
      lo += (hi & 0x7FFF) << 16;
      if (lo > M) {
        lo &= M;
        ++lo;
      }
      lo += hi >> 15;
      if (lo > M) {
        lo &= M;
        ++lo;
      }
      return (seed_ = (int32_t) lo);
    }